

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * FindFrontMostVisibleChildWindow(ImGuiWindow *window)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow *pIVar3;
  int local_1c;
  int n;
  ImGuiWindow *window_local;
  
  local_1c = (window->DC).ChildWindows.Size;
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return window;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(window->DC).ChildWindows,local_1c);
    bVar1 = IsWindowActiveAndVisible(*ppIVar2);
  } while (!bVar1);
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(window->DC).ChildWindows,local_1c);
  pIVar3 = FindFrontMostVisibleChildWindow(*ppIVar2);
  return pIVar3;
}

Assistant:

static ImGuiWindow* FindFrontMostVisibleChildWindow(ImGuiWindow* window)
{
    for (int n = window->DC.ChildWindows.Size - 1; n >= 0; n--)
        if (IsWindowActiveAndVisible(window->DC.ChildWindows[n]))
            return FindFrontMostVisibleChildWindow(window->DC.ChildWindows[n]);
    return window;
}